

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathCompareValues(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  uint local_34;
  int n_strict;
  int strict;
  int n_inf;
  int inf;
  int n_ctxt;
  xmlXPathParserContextPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_inf = 0; n_inf < 1; n_inf = n_inf + 1) {
    for (n_strict = 0; n_strict < 4; n_strict = n_strict + 1) {
      for (local_34 = 0; (int)local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        iVar2 = gen_int(n_strict,1);
        val = gen_int(local_34,2);
        val_00 = xmlXPathCompareValues(0,iVar2,val);
        desret_int(val_00);
        call_tests = call_tests + 1;
        des_int(n_strict,iVar2,1);
        des_int(local_34,val,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathCompareValues",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)(uint)n_inf);
          printf(" %d",(ulong)(uint)n_strict);
          printf(" %d",(ulong)local_34);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlXPathCompareValues(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    int ret_val;
    xmlXPathParserContextPtr ctxt; /* the XPath Parser context */
    int n_ctxt;
    int inf; /* less than (1) or greater than (0) */
    int n_inf;
    int strict; /* is the comparison strict */
    int n_strict;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlXPathParserContextPtr;n_ctxt++) {
    for (n_inf = 0;n_inf < gen_nb_int;n_inf++) {
    for (n_strict = 0;n_strict < gen_nb_int;n_strict++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlXPathParserContextPtr(n_ctxt, 0);
        inf = gen_int(n_inf, 1);
        strict = gen_int(n_strict, 2);

        ret_val = xmlXPathCompareValues(ctxt, inf, strict);
        desret_int(ret_val);
        call_tests++;
        des_xmlXPathParserContextPtr(n_ctxt, ctxt, 0);
        des_int(n_inf, inf, 1);
        des_int(n_strict, strict, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathCompareValues",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_inf);
            printf(" %d", n_strict);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}